

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O0

cmNinjaDeps * __thiscall
cmNinjaTargetGenerator::ComputeLinkDeps
          (cmNinjaDeps *__return_storage_ptr__,cmNinjaTargetGenerator *this,string *linkLanguage)

{
  cmGeneratorTarget *pcVar1;
  bool bVar2;
  TargetType TVar3;
  string *psVar4;
  size_type __n;
  const_iterator __first;
  const_iterator __last;
  iterator iVar5;
  MapToNinjaPathImpl MVar6;
  ModuleDefinitionInfo *pMVar7;
  reference ppcVar8;
  reference ppcVar9;
  iterator __last_00;
  back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __result;
  undefined1 local_128 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  linkDeps;
  cmSourceFile *manifest_src;
  iterator __end1;
  iterator __begin1;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *__range1;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> manifest_srcs;
  cmSourceFile *src;
  const_iterator __end2;
  const_iterator __begin2;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *__range2;
  ModuleDefinitionInfo *mdi;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_32;
  byte local_31;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_30;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *deps;
  cmComputeLinkInformation *cli;
  string *linkLanguage_local;
  cmNinjaTargetGenerator *this_local;
  cmNinjaDeps *result;
  
  cli = (cmComputeLinkInformation *)linkLanguage;
  linkLanguage_local = (string *)this;
  this_local = (cmNinjaTargetGenerator *)__return_storage_ptr__;
  TVar3 = cmGeneratorTarget::GetType((this->super_cmCommonTargetGenerator).GeneratorTarget);
  if ((TVar3 == STATIC_LIBRARY) ||
     (TVar3 = cmGeneratorTarget::GetType((this->super_cmCommonTargetGenerator).GeneratorTarget),
     TVar3 == OBJECT_LIBRARY)) {
    memset(__return_storage_ptr__,0,0x18);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(__return_storage_ptr__);
  }
  else {
    pcVar1 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
    psVar4 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_(&this->super_cmCommonTargetGenerator)
    ;
    deps = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)cmGeneratorTarget::GetLinkInformation(pcVar1,psVar4);
    if ((cmComputeLinkInformation *)deps == (cmComputeLinkInformation *)0x0) {
      memset(__return_storage_ptr__,0,0x18);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(__return_storage_ptr__);
    }
    else {
      local_30 = cmComputeLinkInformation::GetDepends_abi_cxx11_((cmComputeLinkInformation *)deps);
      local_31 = 0;
      __n = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(local_30);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator(&local_32);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(__return_storage_ptr__,__n,&local_32);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator(&local_32);
      __first = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::begin(local_30);
      __last = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end(local_30);
      iVar5 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::begin(__return_storage_ptr__);
      MVar6 = MapToNinjaPath(this);
      std::
      transform<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,cmGlobalNinjaGenerator::MapToNinjaPathImpl>
                ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )__first._M_current,
                 (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )__last._M_current,
                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )iVar5._M_current,MVar6);
      pcVar1 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
      psVar4 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_
                         (&this->super_cmCommonTargetGenerator);
      pMVar7 = cmGeneratorTarget::GetModuleDefinitionInfo(pcVar1,psVar4);
      if (pMVar7 != (ModuleDefinitionInfo *)0x0) {
        __end2 = std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::begin
                           (&pMVar7->Sources);
        src = (cmSourceFile *)
              std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::end
                        (&pMVar7->Sources);
        while (bVar2 = __gnu_cxx::operator!=
                                 (&__end2,(__normal_iterator<const_cmSourceFile_*const_*,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
                                           *)&src), bVar2) {
          ppcVar8 = __gnu_cxx::
                    __normal_iterator<const_cmSourceFile_*const_*,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
                    ::operator*(&__end2);
          psVar4 = cmSourceFile::GetFullPath_abi_cxx11_(*ppcVar8);
          ConvertToNinjaPath((string *)
                             &manifest_srcs.
                              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,this,psVar4);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(__return_storage_ptr__,
                      (value_type *)
                      &manifest_srcs.
                       super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::__cxx11::string::~string
                    ((string *)
                     &manifest_srcs.
                      super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          __gnu_cxx::
          __normal_iterator<const_cmSourceFile_*const_*,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
          ::operator++(&__end2);
        }
      }
      std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::vector
                ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)&__range1);
      cmGeneratorTarget::GetManifests
                ((this->super_cmCommonTargetGenerator).GeneratorTarget,
                 (vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)&__range1,
                 &(this->super_cmCommonTargetGenerator).ConfigName);
      __end1 = std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::begin
                         ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
                          &__range1);
      manifest_src = (cmSourceFile *)
                     std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::end
                               ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                                 *)&__range1);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end1,(__normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
                                         *)&manifest_src), bVar2) {
        ppcVar9 = __gnu_cxx::
                  __normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
                  ::operator*(&__end1);
        psVar4 = cmSourceFile::GetFullPath_abi_cxx11_(*ppcVar9);
        ConvertToNinjaPath((string *)
                           &linkDeps.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,this,psVar4);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(__return_storage_ptr__,
                    (value_type *)
                    &linkDeps.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::__cxx11::string::~string
                  ((string *)
                   &linkDeps.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        __gnu_cxx::
        __normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
        ::operator++(&__end1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_128);
      cmGeneratorTarget::GetLinkDepends
                ((this->super_cmCommonTargetGenerator).GeneratorTarget,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_128,&(this->super_cmCommonTargetGenerator).ConfigName,(string *)cli);
      iVar5 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_128);
      __last_00 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_128);
      __result = std::
                 back_inserter<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                           (__return_storage_ptr__);
      MVar6 = MapToNinjaPath(this);
      std::
      transform<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,cmGlobalNinjaGenerator::MapToNinjaPathImpl>
                ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )iVar5._M_current,
                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )__last_00._M_current,__result,MVar6);
      local_31 = 1;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_128);
      std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~vector
                ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)&__range1);
      if ((local_31 & 1) == 0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(__return_storage_ptr__);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

cmNinjaDeps cmNinjaTargetGenerator::ComputeLinkDeps(
  const std::string& linkLanguage) const
{
  // Static libraries never depend on other targets for linking.
  if (this->GeneratorTarget->GetType() == cmStateEnums::STATIC_LIBRARY ||
      this->GeneratorTarget->GetType() == cmStateEnums::OBJECT_LIBRARY) {
    return cmNinjaDeps();
  }

  cmComputeLinkInformation* cli =
    this->GeneratorTarget->GetLinkInformation(this->GetConfigName());
  if (!cli) {
    return cmNinjaDeps();
  }

  const std::vector<std::string>& deps = cli->GetDepends();
  cmNinjaDeps result(deps.size());
  std::transform(deps.begin(), deps.end(), result.begin(), MapToNinjaPath());

  // Add a dependency on the link definitions file, if any.
  if (cmGeneratorTarget::ModuleDefinitionInfo const* mdi =
        this->GeneratorTarget->GetModuleDefinitionInfo(
          this->GetConfigName())) {
    for (cmSourceFile const* src : mdi->Sources) {
      result.push_back(this->ConvertToNinjaPath(src->GetFullPath()));
    }
  }

  // Add a dependency on user-specified manifest files, if any.
  std::vector<cmSourceFile const*> manifest_srcs;
  this->GeneratorTarget->GetManifests(manifest_srcs, this->ConfigName);
  for (cmSourceFile const* manifest_src : manifest_srcs) {
    result.push_back(this->ConvertToNinjaPath(manifest_src->GetFullPath()));
  }

  // Add user-specified dependencies.
  std::vector<std::string> linkDeps;
  this->GeneratorTarget->GetLinkDepends(linkDeps, this->ConfigName,
                                        linkLanguage);
  std::transform(linkDeps.begin(), linkDeps.end(), std::back_inserter(result),
                 MapToNinjaPath());

  return result;
}